

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.h
# Opt level: O1

void __thiscall
Js::PathTypeHandlerBase::InvalidateFixedFieldAt
          (PathTypeHandlerBase *this,PropertyId propertyId,PropertyIndex index,
          ScriptContext *scriptContext)

{
  bool bVar1;
  
  if (DAT_015d6361 == '\x01') {
    bVar1 = TypePath::GetIsUsedFixedFieldAt
                      ((this->typePath).ptr,index,
                       (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
    if (bVar1) {
      ThreadContext::InvalidatePropertyGuards(scriptContext->threadContext,propertyId);
    }
    TypePath::ClearIsFixedFieldAt
              ((this->typePath).ptr,index,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1))
    ;
    return;
  }
  return;
}

Assistant:

static bool FixPropsOnPathTypes()
        {
#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            return CONFIG_FLAG(FixPropsOnPathTypes);
#else
            return false;
#endif
        }